

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::CompactReporter::AssertionPrinter::print(AssertionPrinter *this)

{
  OfType OVar1;
  AssertionResult *pAVar2;
  Code colour;
  string *psVar3;
  allocator<char> local_1e9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  string local_1c8;
  string local_1a8;
  string local_188;
  string local_168;
  string local_148;
  string local_128;
  string local_108;
  string local_e8;
  string local_c8;
  string local_a8;
  string local_88;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  string local_28;
  
  printSourceInfo(this);
  pAVar2 = this->result;
  (this->itMessage)._M_current =
       (this->messages).super__Vector_base<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>.
       _M_impl.super__Vector_impl_data._M_start;
  OVar1 = (pAVar2->m_resultData).resultType;
  switch(OVar1) {
  case Ok:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"passed",(allocator<char> *)&local_1e8);
    printResultType(this,BrightGreen,&local_28);
    std::__cxx11::string::~string((string *)&local_28);
    printOriginalExpression(this);
    printReconstructedExpression(this);
    if ((this->result->m_info).capturedExpression._M_string_length != 0) goto LAB_001578e3;
LAB_0015773f:
    colour = None;
    goto LAB_001578e9;
  case Info:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_148,"info",(allocator<char> *)&local_1e8);
    printResultType(this,None,&local_148);
    psVar3 = &local_148;
    goto LAB_001576d5;
  case Warning:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_168,"warning",(allocator<char> *)&local_1e8);
    printResultType(this,None,&local_168);
    psVar3 = &local_168;
LAB_001576d5:
    std::__cxx11::string::~string((string *)psVar3);
    printMessage(this);
LAB_001578e3:
    colour = FileName;
LAB_001578e9:
    printRemainingMessages(this,colour);
    break;
  default:
    if (OVar1 != FailureBit) {
      if (OVar1 == ExpressionFailed) {
        if (((pAVar2->m_info).resultDisposition & SuppressFail) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_68,"failed",(allocator<char> *)&local_1e8);
          printResultType(this,BrightRed,&local_68);
          psVar3 = &local_68;
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1e8," - but was ok",&local_1e9);
          std::operator+(&local_48,"failed",&local_1e8);
          printResultType(this,BrightGreen,&local_48);
          std::__cxx11::string::~string((string *)&local_48);
          psVar3 = &local_1e8;
        }
        std::__cxx11::string::~string((string *)psVar3);
        printOriginalExpression(this);
        printReconstructedExpression(this);
        goto LAB_001578e3;
      }
      if (OVar1 == ExplicitFailure) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_188,"failed",(allocator<char> *)&local_1e8);
        printResultType(this,BrightRed,&local_188);
        std::__cxx11::string::~string((string *)&local_188);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_1a8,"explicitly",(allocator<char> *)&local_1e8);
        printIssue(this,&local_1a8);
        std::__cxx11::string::~string((string *)&local_1a8);
        goto LAB_0015773f;
      }
      if (OVar1 == Exception) goto switchD_001575d4_caseD_ffffffff;
      if (OVar1 == ThrewException) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_88,"failed",(allocator<char> *)&local_1e8);
        printResultType(this,BrightRed,&local_88);
        std::__cxx11::string::~string((string *)&local_88);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a8,"unexpected exception with message:",
                   (allocator<char> *)&local_1e8);
        printIssue(this,&local_a8);
        psVar3 = &local_a8;
LAB_001577b3:
        std::__cxx11::string::~string((string *)psVar3);
        printMessage(this);
      }
      else {
        if (OVar1 != DidntThrowException) {
          if (OVar1 != FatalErrorCondition) {
            return;
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_c8,"failed",(allocator<char> *)&local_1e8);
          printResultType(this,BrightRed,&local_c8);
          std::__cxx11::string::~string((string *)&local_c8);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_e8,"fatal error condition with message:",
                     (allocator<char> *)&local_1e8);
          printIssue(this,&local_e8);
          psVar3 = &local_e8;
          goto LAB_001577b3;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_108,"failed",(allocator<char> *)&local_1e8);
        printResultType(this,BrightRed,&local_108);
        std::__cxx11::string::~string((string *)&local_108);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_128,"expected exception, got none",(allocator<char> *)&local_1e8
                  );
        printIssue(this,&local_128);
        std::__cxx11::string::~string((string *)&local_128);
      }
      printExpressionWas(this);
      goto LAB_001578e3;
    }
  case Unknown:
switchD_001575d4_caseD_ffffffff:
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,"** internal error **",(allocator<char> *)&local_1e8);
    printResultType(this,BrightRed,&local_1c8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  return;
}

Assistant:

void print() {
                printSourceInfo();

                itMessage = messages.begin();

                switch( result.getResultType() ) {
                    case ResultWas::Ok:
                        printResultType( Colour::ResultSuccess, passedString() );
                        printOriginalExpression();
                        printReconstructedExpression();
                        if ( ! result.hasExpression() )
                            printRemainingMessages( Colour::None );
                        else
                            printRemainingMessages();
                        break;
                    case ResultWas::ExpressionFailed:
                        if( result.isOk() )
                            printResultType( Colour::ResultSuccess, failedString() + std::string( " - but was ok" ) );
                        else
                            printResultType( Colour::Error, failedString() );
                        printOriginalExpression();
                        printReconstructedExpression();
                        printRemainingMessages();
                        break;
                    case ResultWas::ThrewException:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "unexpected exception with message:" );
                        printMessage();
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::FatalErrorCondition:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "fatal error condition with message:" );
                        printMessage();
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::DidntThrowException:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "expected exception, got none" );
                        printExpressionWas();
                        printRemainingMessages();
                        break;
                    case ResultWas::Info:
                        printResultType( Colour::None, "info" );
                        printMessage();
                        printRemainingMessages();
                        break;
                    case ResultWas::Warning:
                        printResultType( Colour::None, "warning" );
                        printMessage();
                        printRemainingMessages();
                        break;
                    case ResultWas::ExplicitFailure:
                        printResultType( Colour::Error, failedString() );
                        printIssue( "explicitly" );
                        printRemainingMessages( Colour::None );
                        break;
                    // These cases are here to prevent compiler warnings
                    case ResultWas::Unknown:
                    case ResultWas::FailureBit:
                    case ResultWas::Exception:
                        printResultType( Colour::Error, "** internal error **" );
                        break;
                }
            }